

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O1

Error __thiscall
asmjit::v1_14::BaseBuilder::_emit
          (BaseBuilder *this,InstId instId,Operand_ *o0,Operand_ *o1,Operand_ *o2,Operand_ *opExt)

{
  uint32_t uVar1;
  char *__s;
  Error EVar2;
  int iVar3;
  BaseNode *node;
  undefined4 extraout_var;
  ulong uVar4;
  long lVar5;
  BaseNode BVar6;
  uint uVar7;
  uint uVar8;
  InstOptions options;
  InstId local_a8;
  InstOptions local_a4;
  RegOnly local_a0;
  Operand_ local_98;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  uint32_t local_68;
  undefined8 local_64;
  undefined8 uStack_5c;
  uint32_t local_54;
  uint32_t uStack_50;
  uint32_t uStack_4c;
  uint32_t uStack_48;
  undefined8 local_44;
  uint32_t local_3c;
  
  uVar1 = (opExt->_signature)._bits;
  if (uVar1 == 0) {
    uVar7 = 2;
    if ((o1->_signature)._bits == 0) {
      uVar7 = (uint)((o0->_signature)._bits != 0);
    }
    uVar8 = 3;
    if ((o2->_signature)._bits == 0) {
      uVar8 = uVar7;
    }
  }
  else if (opExt[1]._signature._bits == 0) {
    uVar8 = 4;
  }
  else {
    uVar8 = 6 - (opExt[2]._signature._bits == 0);
  }
  options = (this->super_BaseEmitter)._forcedInstOptions | (this->super_BaseEmitter)._instOptions;
  if ((options & kReserved) == kNone) {
LAB_00117900:
    if (*(long *)&this->_allocator == 0) {
LAB_00117ad7:
      _emit();
    }
    else {
      uVar7 = (uint)(4 < uVar8) * 2 + 4;
      node = (BaseNode *)
             ZoneAllocator::_alloc
                       (&this->_allocator,(ulong)(uVar7 * 0x10 + 0x40),(size_t *)&local_98);
      __s = (this->super_BaseEmitter)._inlineComment;
      (this->super_BaseEmitter)._instOptions = kNone;
      (this->super_BaseEmitter)._inlineComment = (char *)0x0;
      if (node != (BaseNode *)0x0) {
        *(undefined8 *)node = 0;
        *(undefined8 *)(node + 8) = 0;
        node[0x10] = (BaseNode)0x1;
        node[0x11] = (BaseNode)(this->_nodeFlags | (kActsAsInst|kIsRemovable|kIsCode));
        *(undefined8 *)(node + 0x12) = 0;
        *(undefined8 *)(node + 0x1a) = 0;
        *(undefined8 *)(node + 0x20) = 0;
        *(undefined8 *)(node + 0x28) = 0;
        *(InstId *)(node + 0x30) = instId;
        *(InstOptions *)(node + 0x34) = options;
        *(undefined8 *)(node + 0x38) = 0;
        BVar6 = SUB41(uVar7,0);
        node[0x13] = BVar6;
        node[0x12] = SUB41(uVar8,0);
        *(RegOnly *)(node + 0x38) = (this->super_BaseEmitter)._extraReg;
        if (uVar7 == 0) {
          _emit();
LAB_00117afa:
          _emit();
        }
        else {
          *(undefined8 *)(node + 0x40) = *(undefined8 *)o0;
          *(uint32_t *)(node + 0x48) = o0->_data[0];
          *(uint32_t *)(node + 0x4c) = o0->_data[1];
          if (BVar6 == (BaseNode)0x1) goto LAB_00117afa;
          *(undefined8 *)(node + 0x50) = *(undefined8 *)o1;
          *(uint32_t *)(node + 0x58) = o1->_data[0];
          *(uint32_t *)(node + 0x5c) = o1->_data[1];
          if (2 < (byte)BVar6) {
            *(undefined8 *)(node + 0x60) = *(undefined8 *)o2;
            *(uint32_t *)(node + 0x68) = o2->_data[0];
            *(uint32_t *)(node + 0x6c) = o2->_data[1];
            if (3 < uVar8) {
              uVar4 = 3;
              lVar5 = 0x7c;
              do {
                if ((byte)node[0x13] <= uVar4) {
                  _emit();
                  goto LAB_00117ad7;
                }
                *(undefined8 *)(node + lVar5 + -0xc) = *(undefined8 *)((long)opExt + lVar5 + -0x7c);
                *(undefined4 *)(node + lVar5 + -4) =
                     *(undefined4 *)((long)opExt->_data + lVar5 + -0x7c);
                *(undefined4 *)(node + lVar5) = *(undefined4 *)((long)opExt[-7]._data + lVar5 + -8);
                uVar4 = uVar4 + 1;
                lVar5 = lVar5 + 0x10;
              } while (uVar8 != uVar4);
            }
            if (uVar8 < uVar7) {
              memset(node + (ulong)uVar8 * 0x10 + 0x40,0,(ulong)(uVar7 + ~uVar8) * 0x10 + 0x10);
            }
            if (__s != (char *)0x0) {
              strlen(__s);
              iVar3 = Zone::dup(&this->_dataZone,(int)__s);
              *(ulong *)(node + 0x28) = CONCAT44(extraout_var,iVar3);
            }
            addNode(this,node);
            (this->super_BaseEmitter)._extraReg._signature = 0;
            (this->super_BaseEmitter)._extraReg._id = 0;
            return 0;
          }
        }
        _emit();
        goto LAB_00117b04;
      }
    }
    (this->super_BaseEmitter)._extraReg._signature = 0;
    (this->super_BaseEmitter)._extraReg._id = 0;
    EVar2 = BaseEmitter::reportError(&this->super_BaseEmitter,1,(char *)0x0);
  }
  else {
    if ((this->super_BaseEmitter)._code != (CodeHolder *)0x0) {
      if (((this->super_BaseEmitter)._diagnosticOptions & kValidateIntermediate) != kNone) {
        local_98._signature._bits = (o0->_signature)._bits;
        local_98._baseId = o0->_baseId;
        local_98._data = *&o0->_data;
        local_88._0_4_ = o1->_signature;
        local_88._4_4_ = o1->_baseId;
        uStack_80 = *(undefined8 *)o1->_data;
        local_78._0_4_ = o2->_signature;
        local_78._4_4_ = o2->_baseId;
        uStack_70 = *(undefined8 *)o2->_data;
        local_64._0_4_ = opExt->_baseId;
        local_64._4_4_ = opExt->_data[0];
        uStack_5c = *(undefined8 *)(opExt->_data + 1);
        local_54 = opExt[1]._baseId;
        uStack_50 = opExt[1]._data[0];
        uStack_4c = opExt[1]._data[1];
        uStack_48 = opExt[2]._signature._bits;
        local_44._0_4_ = opExt[2]._baseId;
        local_44._4_4_ = opExt[2]._data[0];
        local_3c = opExt[2]._data[1];
        local_a0 = (this->super_BaseEmitter)._extraReg;
        local_a8 = instId;
        local_a4 = options;
        local_68 = uVar1;
        EVar2 = (*(this->super_BaseEmitter)._funcs.validate)
                          ((BaseInst *)&local_a8,&local_98,(size_t)uVar8,
                           SUB14((this->super_BaseEmitter)._emitterType == kCompiler,0));
        if (EVar2 != 0) {
          EVar2 = EmitterUtils::logInstructionFailed
                            (&this->super_BaseEmitter,EVar2,instId,options,o0,o1,o2,opExt);
          return EVar2;
        }
      }
      options = options & ~kReserved;
      goto LAB_00117900;
    }
LAB_00117b04:
    EVar2 = 5;
  }
  return EVar2;
}

Assistant:

Error BaseBuilder::_emit(InstId instId, const Operand_& o0, const Operand_& o1, const Operand_& o2, const Operand_* opExt) {
  uint32_t opCount = EmitterUtils::opCountFromEmitArgs(o0, o1, o2, opExt);
  InstOptions options = instOptions() | forcedInstOptions();

  if (Support::test(options, InstOptions::kReserved)) {
    if (ASMJIT_UNLIKELY(!_code))
      return DebugUtils::errored(kErrorNotInitialized);

#ifndef ASMJIT_NO_VALIDATION
    // Strict validation.
    if (hasDiagnosticOption(DiagnosticOptions::kValidateIntermediate)) {
      Operand_ opArray[Globals::kMaxOpCount];
      EmitterUtils::opArrayFromEmitArgs(opArray, o0, o1, o2, opExt);

      ValidationFlags validationFlags = isCompiler() ? ValidationFlags::kEnableVirtRegs : ValidationFlags::kNone;
      Error err = _funcs.validate(BaseInst(instId, options, _extraReg), opArray, opCount, validationFlags);

      if (ASMJIT_UNLIKELY(err)) {
#ifndef ASMJIT_NO_LOGGING
        return EmitterUtils::logInstructionFailed(this, err, instId, options, o0, o1, o2, opExt);
#else
        resetState();
        return reportError(err);
#endif
      }
    }
#endif

    // Clear instruction options that should never be part of a regular instruction.
    options &= ~InstOptions::kReserved;
  }

  uint32_t opCapacity = InstNode::capacityOfOpCount(opCount);
  ASMJIT_ASSERT(opCapacity >= InstNode::kBaseOpCapacity);

  InstNode* node = _allocator.allocT<InstNode>(InstNode::nodeSizeOfOpCapacity(opCapacity));
  const char* comment = inlineComment();

  resetInstOptions();
  resetInlineComment();

  if (ASMJIT_UNLIKELY(!node)) {
    resetExtraReg();
    return reportError(DebugUtils::errored(kErrorOutOfMemory));
  }

  node = new(Support::PlacementNew{node}) InstNode(this, instId, options, opCount, opCapacity);
  node->setExtraReg(extraReg());
  node->setOp(0, o0);
  node->setOp(1, o1);
  node->setOp(2, o2);
  for (uint32_t i = 3; i < opCount; i++)
    node->setOp(i, opExt[i - 3]);
  node->resetOpRange(opCount, opCapacity);

  if (comment)
    node->setInlineComment(static_cast<char*>(_dataZone.dup(comment, strlen(comment), true)));

  addNode(node);
  resetExtraReg();
  return kErrorOk;
}